

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitterHandle::mouseMoveEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QSplitterHandlePrivate *pQVar4;
  QSplitterHandlePrivate *this_00;
  QPoint this_01;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar5;
  int pos;
  QSplitterHandlePrivate *d;
  QPoint *in_stack_ffffffffffffff98;
  QSplitterHandlePrivate *pos_00;
  int pos_01;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 auVar6 [12];
  int pos_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QSplitterHandle *)0x6990af);
  if (((byte)pQVar4->field_0x268 >> 2 & 1) != 0) {
    pos_00 = pQVar4;
    this_00 = (QSplitterHandlePrivate *)QWidget::parentWidget((QWidget *)0x6990e1);
    QVar5 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x6990f0);
    auVar6 = QVar5._12_12_;
    this_01 = QPointF::toPoint((QPointF *)in_RDI);
    QWidget::mapFromGlobal(in_RDI,(QPoint *)pos_00);
    pos_01 = (int)((ulong)in_RDI >> 0x20);
    iVar3 = QSplitterHandlePrivate::pick(this_00,in_stack_ffffffffffffff98);
    iVar3 = iVar3 - pQVar4->mouseOffset;
    bVar2 = opaqueResize((QSplitterHandle *)this_00);
    pos_02 = auVar6._8_4_;
    if (bVar2) {
      moveSplitter((QSplitterHandle *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),pos_01);
    }
    else {
      closestLegalPosition(auVar6._4_8_,auVar6._0_4_);
      QSplitter::setRubberBand((QSplitter *)this_01,pos_02);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSplitterHandle::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (!d->pressed)
        return;

    const int pos = d->pick(parentWidget()->mapFromGlobal(e->globalPosition().toPoint()))
                    - d->mouseOffset;
    if (opaqueResize()) {
        moveSplitter(pos);
    } else {
        d->s->setRubberBand(closestLegalPosition(pos));
    }
}